

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.h
# Opt level: O0

void __thiscall
mp::SOLReader2<ExampleSOLHandler>::SOLReader2
          (SOLReader2<ExampleSOLHandler> *this,ExampleSOLHandler *sh,NLUtils *utl)

{
  ExampleModel *in_RDX;
  ExampleModel *in_RSI;
  ExampleSOLHandler *in_RDI;
  
  in_RDI->mdl_ = in_RSI;
  in_RDI[1].mdl_ = in_RDX;
  ExampleSOLHandler::Header(in_RDI);
  std::__cxx11::string::string((string *)(in_RDI + 0x24));
  std::__cxx11::string::string((string *)(in_RDI + 0x28));
  *(undefined4 *)&in_RDI[0x2c].mdl_ = 0;
  *(undefined4 *)((long)&in_RDI[0x2c].mdl_ + 4) = 0xffffffff;
  in_RDI[0x2d].mdl_ = (ExampleModel *)0x0;
  in_RDI[0x2e].mdl_ = (ExampleModel *)"ASCII";
  in_RDI[0x2f].mdl_ = (ExampleModel *)"binary";
  *(undefined4 *)&in_RDI[0x74].mdl_ = 0xfffffffe;
  *(undefined4 *)((long)&in_RDI[0x74].mdl_ + 4) = 0xfffffffe;
  *(undefined4 *)((long)&in_RDI[0x85].mdl_ + 4) = 0xfffffffe;
  return;
}

Assistant:

SOLReader2(SOLHandler& sh, NLUtils& utl) :
			solh_(sh), utils_(utl), hdr_(sh.Header()) { }